

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_DefineProperty(JSContext *ctx,JSValue this_obj,JSAtom prop,JSValue val,JSValue getter,
                     JSValue setter,int flags)

{
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue v_04;
  JSValue v_05;
  JSValue v_06;
  JSValue v_07;
  JSValue v_08;
  JSValue val_00;
  JSValue new_val;
  JSValue new_val_00;
  JSValue op2;
  JSValue op2_00;
  JSValue op1;
  JSValue op1_00;
  JSValue val_01;
  JSValue prop_00;
  JSValue this_obj_00;
  JSValue val_02;
  JSValue val_03;
  JSValue val_04;
  JSValue val_05;
  JSValue getter_00;
  JSValue setter_00;
  JSValue v_09;
  JSValue v_10;
  JSValue v_11;
  JSValue v_12;
  JSValue v_13;
  JSValue v_14;
  int iVar1;
  BOOL BVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t *puVar6;
  uint in_ECX;
  int in_EDX;
  JSObject *in_RSI;
  JSContext *in_RDI;
  JSValueUnion in_R8;
  JSValueUnion in_R9;
  JSValue JVar7;
  uint in_stack_00000028;
  int ret;
  JSValue num;
  uint32_t prop_flags;
  uint32_t idx;
  JSValue val1;
  JSObject *new_setter;
  JSObject *new_getter;
  uint32_t array_length;
  int res;
  int mask;
  JSProperty *pr;
  JSShapeProperty *prs;
  JSObject *p;
  intptr_t h_1;
  JSShapeProperty *prop_2;
  JSShapeProperty *pr_2;
  JSShape *sh_1;
  intptr_t h;
  JSShapeProperty *prop_1;
  JSShapeProperty *pr_1;
  JSShape *sh;
  JSValue v;
  JSVarRef *in_stack_fffffffffffffcc8;
  JSContext *in_stack_fffffffffffffcd0;
  JSValueUnion in_stack_fffffffffffffcd8;
  JSValueUnion in_stack_fffffffffffffce0;
  JSContext *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  undefined4 in_stack_fffffffffffffcf4;
  JSValueUnion in_stack_fffffffffffffcf8;
  JSObject *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 uVar8;
  BOOL in_stack_fffffffffffffd0c;
  undefined4 uVar9;
  JSProperty *in_stack_fffffffffffffd10;
  JSContext *in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd20;
  int in_stack_fffffffffffffd24;
  JSContext *in_stack_fffffffffffffd28;
  JSContext *in_stack_fffffffffffffd30;
  JSValue *pJVar10;
  JSValueUnion p_00;
  JSContext *in_stack_fffffffffffffd48;
  JSValueUnion in_stack_fffffffffffffd50;
  int64_t in_stack_fffffffffffffd58;
  JSValueUnion JVar11;
  JSValueUnion in_stack_fffffffffffffd68;
  int64_t local_290;
  JSAtom in_stack_fffffffffffffd7c;
  JSContext *in_stack_fffffffffffffd80;
  JSValueUnion local_250;
  JSValueUnion local_238;
  JSValueUnion local_230;
  undefined8 in_stack_fffffffffffffdd8;
  JSObject *in_stack_fffffffffffffde0;
  JSContext *in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  uint in_stack_fffffffffffffdfc;
  void *local_198;
  void *local_190;
  JSValueUnion in_stack_fffffffffffffe80;
  JSValueUnion in_stack_fffffffffffffe88;
  int64_t in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  uint in_stack_fffffffffffffe9c;
  int local_150;
  JSValueUnion *local_148;
  JSShapeProperty *local_140;
  JSObject *local_138;
  uint local_12c;
  JSContext *local_128;
  JSValueUnion local_120;
  JSValueUnion local_118;
  uint32_t local_fc;
  JSContext *local_f8;
  uint32_t local_f0;
  undefined8 local_e8;
  ulong local_e0;
  JSShapeProperty *local_d8;
  JSShapeProperty *local_d0;
  JSShape *local_c8;
  JSAtom local_bc;
  JSObject *local_b8;
  JSValueUnion **local_b0;
  JSShapeProperty *local_a8;
  ulong local_a0;
  JSShapeProperty *local_98;
  JSShapeProperty *local_90;
  JSShape *local_88;
  JSAtom local_7c;
  JSObject *local_78;
  JSValueUnion **local_70;
  JSShapeProperty *local_68;
  JSValueUnion local_60;
  JSValueUnion local_58;
  undefined8 local_48;
  JSContext *local_38;
  JSValueUnion local_30;
  JSValueUnion local_28;
  JSContext *local_18;
  undefined4 uStack_c;
  undefined8 local_8;
  
  pJVar10 = (JSValue *)&stack0x00000018;
  p_00.ptr = &stack0x00000008;
  local_138 = in_RSI;
  local_12c = in_ECX;
  local_128 = in_RDI;
  local_120 = in_R8;
  local_118 = in_R9;
  if (in_EDX == -1) {
LAB_0012dff1:
    do {
      local_70 = &local_148;
      local_78 = local_138;
      local_7c = local_12c;
      local_88 = local_138->shape;
      local_a0 = (ulong)(local_12c & local_88->prop_hash_mask);
      puVar6 = prop_hash_end(local_88);
      local_a0 = (ulong)puVar6[-1 - local_a0];
      local_98 = get_shape_prop(local_88);
      while (local_a0 != 0) {
        local_90 = local_98 + (local_a0 - 1);
        if (local_90->atom == local_7c) {
          *local_70 = (JSValueUnion *)(local_78->prop + (local_a0 - 1));
          local_68 = local_90;
          goto LAB_0012e14d;
        }
        local_a0 = (ulong)(*(uint *)local_90 & 0x3ffffff);
      }
      *local_70 = (JSValueUnion *)0x0;
      local_68 = (JSShapeProperty *)0x0;
LAB_0012e14d:
      local_140 = local_68;
      if (local_68 != (JSShapeProperty *)0x0) {
        if (((*(uint *)local_68 >> 0x1a & 8) != 0) && ((in_stack_00000028 & 0x2000) != 0)) {
          v_09.tag = (int64_t)local_118.ptr;
          v_09.u.ptr = local_120.ptr;
          in_stack_fffffffffffffd30 = local_128;
          JVar7 = JS_DupValue(local_128,v_09);
          in_stack_fffffffffffffe88 = JVar7.u;
          in_stack_fffffffffffffe90 = JVar7.tag;
          val_01.u._4_4_ = in_stack_fffffffffffffd24;
          val_01.u.int32 = in_stack_fffffffffffffd20;
          val_01.tag = (int64_t)in_stack_fffffffffffffd28;
          iVar1 = JS_ToArrayLengthFree
                            (in_stack_fffffffffffffd18,(uint32_t *)in_stack_fffffffffffffd10,val_01,
                             in_stack_fffffffffffffd0c);
          if (iVar1 != 0) {
            return -1;
          }
          local_38 = local_128;
          if (in_stack_fffffffffffffe9c < 0x80000000) {
            local_18 = local_128;
            local_8 = 0;
            local_30._4_4_ = uStack_c;
            local_30.int32 = in_stack_fffffffffffffe9c;
            local_48 = 0;
            local_28.float64 = 0.0;
          }
          else {
            _local_60 = __JS_NewFloat64(local_128,(double)in_stack_fffffffffffffe9c);
            local_30 = local_60;
            local_28 = local_58;
          }
          local_120 = local_30;
          local_118.float64 = local_28.float64;
          local_b0 = &local_148;
          local_b8 = local_138;
          local_bc = local_12c;
          local_c8 = local_138->shape;
          local_e0 = (ulong)(local_12c & local_c8->prop_hash_mask);
          in_stack_fffffffffffffe80 = local_28;
          puVar6 = prop_hash_end(local_c8);
          local_e0 = (ulong)puVar6[-1 - local_e0];
          local_d8 = get_shape_prop(local_c8);
          while (local_e0 != 0) {
            local_d0 = local_d8 + (local_e0 - 1);
            if (local_d0->atom == local_bc) {
              *local_b0 = (JSValueUnion *)(local_b8->prop + (local_e0 - 1));
              local_a8 = local_d0;
              goto LAB_0012e498;
            }
            local_e0 = (ulong)(*(uint *)local_d0 & 0x3ffffff);
          }
          *local_b0 = (JSValueUnion *)0x0;
          local_a8 = (JSShapeProperty *)0x0;
LAB_0012e498:
          local_140 = local_a8;
        }
        BVar2 = check_define_prop_flags(*(uint *)local_140 >> 0x1a,in_stack_00000028);
        if (BVar2 == 0) {
LAB_0012e4c8:
          iVar1 = JS_ThrowTypeErrorOrFalse
                            (local_128,(int)(ulong)in_stack_00000028,"property is not configurable")
          ;
          return iVar1;
        }
        if ((*(uint *)local_140 >> 0x1a & 0x30) != 0x30) {
          if ((in_stack_00000028 & 0x3a00) != 0) {
            if ((in_stack_00000028 & 0x1800) == 0) {
              if ((*(uint *)local_140 >> 0x1a & 0x30) == 0x10) {
                iVar1 = js_shape_prepare_update
                                  (in_stack_fffffffffffffce8,
                                   (JSObject *)in_stack_fffffffffffffce0.ptr,
                                   (JSShapeProperty **)in_stack_fffffffffffffcd8.ptr);
                if (iVar1 != 0) {
                  return -1;
                }
                if (local_148->ptr != (void *)0x0) {
                  v_03.tag = (int64_t)in_stack_fffffffffffffce0.ptr;
                  v_03.u.float64 = in_stack_fffffffffffffcd8.float64;
                  JS_FreeValue(in_stack_fffffffffffffcd0,v_03);
                }
                if (local_148[1].ptr != (void *)0x0) {
                  v_04.tag = (int64_t)in_stack_fffffffffffffce0.ptr;
                  v_04.u.float64 = in_stack_fffffffffffffcd8.float64;
                  JS_FreeValue(in_stack_fffffffffffffcd0,v_04);
                }
                *(uint *)local_140 =
                     *(uint *)local_140 & 0x3ffffff | (*(uint *)local_140 >> 0x1a & 0xd) << 0x1a;
                local_148->ptr = (void *)((ulong)in_stack_fffffffffffffdfc << 0x20);
                local_148[1].float64 = 1.48219693752374e-323;
              }
              else if ((((*(uint *)local_140 >> 0x1a & 0x30) != 0x20) &&
                       ((*(uint *)local_140 >> 0x1a & 3) == 0)) &&
                      ((in_stack_00000028 & 0x2000) != 0)) {
                op1.u._4_4_ = in_stack_fffffffffffffd0c;
                op1.u.int32 = in_stack_fffffffffffffd08;
                op1.tag = (int64_t)in_stack_fffffffffffffd10;
                op2.tag = (int64_t)in_stack_fffffffffffffd00;
                op2.u.ptr = in_stack_fffffffffffffcf8.ptr;
                BVar2 = js_same_value((JSContext *)
                                      CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                                      op1,op2);
                if (BVar2 != 0) {
                  return 1;
                }
                goto LAB_0012e4c8;
              }
              iVar1 = (int)((ulong)pJVar10 >> 0x20);
              if ((*(uint *)local_140 >> 0x1a & 0x30) == 0x20) {
                if ((in_stack_00000028 & 0x2000) != 0) {
                  if (((local_138->field_0).header.dummy2 == 0xb) &&
                     (op1_00.u._4_4_ = in_stack_fffffffffffffd0c,
                     op1_00.u.int32 = in_stack_fffffffffffffd08,
                     op1_00.tag = (int64_t)in_stack_fffffffffffffd10,
                     op2_00.tag = (int64_t)in_stack_fffffffffffffd00,
                     op2_00.u.float64 = in_stack_fffffffffffffcf8.float64,
                     BVar2 = js_same_value((JSContext *)
                                           CONCAT44(in_stack_fffffffffffffcf4,
                                                    in_stack_fffffffffffffcf0),op1_00,op2_00),
                     BVar2 == 0)) goto LAB_0012e4c8;
                  v_10.tag = (int64_t)local_118.ptr;
                  v_10.u.ptr = local_120.ptr;
                  JS_DupValue(local_128,v_10);
                  new_val.tag._0_4_ = in_stack_fffffffffffffcf0;
                  new_val.u.ptr = in_stack_fffffffffffffce8;
                  new_val.tag._4_4_ = in_stack_fffffffffffffcf4;
                  set_value((JSContext *)in_stack_fffffffffffffce0.ptr,
                            (JSValue *)in_stack_fffffffffffffcd8.ptr,new_val);
                }
                if ((in_stack_00000028 & 0x202) == 0x200) {
                  iVar1 = js_shape_prepare_update
                                    (in_stack_fffffffffffffce8,
                                     (JSObject *)in_stack_fffffffffffffce0.ptr,
                                     (JSShapeProperty **)in_stack_fffffffffffffcd8.ptr);
                  if (iVar1 != 0) {
                    return -1;
                  }
                  JVar7 = JS_DupValue(local_128,**(JSValue **)((long)local_148->ptr + 0x18));
                  local_238 = JVar7.u;
                  local_230 = (JSValueUnion)JVar7.tag;
                  free_var_ref((JSRuntime *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
                  *local_148 = local_238;
                  local_148[1] = local_230;
                  *(uint *)local_140 =
                       *(uint *)local_140 & 0x3ffffff | (*(uint *)local_140 >> 0x1a & 0xd) << 0x1a;
                }
              }
              else {
                if ((*(uint *)local_140 >> 0x1a & 8) != 0) {
                  if ((in_stack_00000028 & 0x2000) == 0) {
                    local_150 = 1;
                  }
                  else {
                    v_11.tag = (int64_t)local_118.ptr;
                    v_11.u.ptr = local_120.ptr;
                    JS_DupValue(local_128,v_11);
                    val_02.tag = in_stack_fffffffffffffd58;
                    val_02.u.float64 = in_stack_fffffffffffffd50.float64;
                    local_150 = set_array_length(in_stack_fffffffffffffd48,(JSObject *)p_00.ptr,
                                                 val_02,iVar1);
                  }
                  if ((in_stack_00000028 & 0x202) == 0x200) {
                    local_140 = get_shape_prop(local_138->shape);
                    iVar1 = js_update_property_flags
                                      ((JSContext *)in_stack_fffffffffffffcd8.ptr,
                                       (JSObject *)in_stack_fffffffffffffcd0,
                                       (JSShapeProperty **)in_stack_fffffffffffffcc8,0);
                    if (iVar1 != 0) {
                      return -1;
                    }
                  }
                  return local_150;
                }
                if ((in_stack_00000028 & 0x2000) != 0) {
                  v_05.tag = (int64_t)in_stack_fffffffffffffce0.ptr;
                  v_05.u.float64 = in_stack_fffffffffffffcd8.float64;
                  JS_FreeValue(in_stack_fffffffffffffcd0,v_05);
                  uVar8 = SUB84(local_148,0);
                  uVar9 = (undefined4)((ulong)local_148 >> 0x20);
                  v_12.tag = (int64_t)local_118.ptr;
                  v_12.u.ptr = local_120.ptr;
                  JVar7 = JS_DupValue(local_128,v_12);
                  *(JSValueUnion *)CONCAT44(uVar9,uVar8) = JVar7.u;
                  local_250 = (JSValueUnion)JVar7.tag;
                  ((JSValueUnion *)CONCAT44(uVar9,uVar8))[1] = local_250;
                }
                if (((in_stack_00000028 & 0x200) != 0) &&
                   (iVar1 = js_update_property_flags
                                      ((JSContext *)in_stack_fffffffffffffcd8.ptr,
                                       (JSObject *)in_stack_fffffffffffffcd0,
                                       (JSShapeProperty **)in_stack_fffffffffffffcc8,0), iVar1 != 0)
                   ) {
                  return -1;
                }
              }
            }
            else {
              iVar1 = JS_IsFunction(local_128,*p_00.ptr);
              if (iVar1 == 0) {
                local_190 = (void *)0x0;
              }
              else {
                local_190 = *p_00.ptr;
              }
              iVar1 = JS_IsFunction(local_128,*pJVar10);
              if (iVar1 == 0) {
                local_198 = (void *)0x0;
              }
              else {
                local_198 = (pJVar10->u).ptr;
              }
              if ((*(uint *)local_140 >> 0x1a & 0x30) == 0x10) {
                if (((*(uint *)local_140 >> 0x1a & 1) == 0) &&
                   ((((in_stack_00000028 & 0x800) != 0 && (local_190 != local_148->ptr)) ||
                    (((in_stack_00000028 & 0x1000) != 0 && (local_198 != local_148[1].ptr))))))
                goto LAB_0012e4c8;
              }
              else {
                iVar1 = js_shape_prepare_update
                                  (in_stack_fffffffffffffce8,
                                   (JSObject *)in_stack_fffffffffffffce0.ptr,
                                   (JSShapeProperty **)in_stack_fffffffffffffcd8.ptr);
                if (iVar1 != 0) {
                  return -1;
                }
                if ((*(uint *)local_140 >> 0x1a & 0x30) == 0x20) {
                  free_var_ref((JSRuntime *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
                }
                else {
                  v_00.tag = (int64_t)in_stack_fffffffffffffce0.ptr;
                  v_00.u.ptr = in_stack_fffffffffffffcd8.ptr;
                  JS_FreeValue(in_stack_fffffffffffffcd0,v_00);
                }
                *(uint *)local_140 =
                     *(uint *)local_140 & 0x3ffffff |
                     (*(uint *)local_140 >> 0x1a & 5 | 0x10) << 0x1a;
                local_148->float64 = 0.0;
                local_148[1].float64 = 0.0;
              }
              if ((in_stack_00000028 & 0x800) != 0) {
                if (local_148->ptr != (void *)0x0) {
                  v_01.tag = (int64_t)in_stack_fffffffffffffce0.ptr;
                  v_01.u.ptr = in_stack_fffffffffffffcd8.ptr;
                  JS_FreeValue(in_stack_fffffffffffffcd0,v_01);
                }
                if (local_190 != (void *)0x0) {
                  JS_DupValue(local_128,*p_00.ptr);
                }
                local_148->ptr = local_190;
              }
              if ((in_stack_00000028 & 0x1000) != 0) {
                if (local_148[1].ptr != (void *)0x0) {
                  v_02.tag = (int64_t)in_stack_fffffffffffffce0.ptr;
                  v_02.u.ptr = in_stack_fffffffffffffcd8.ptr;
                  JS_FreeValue(in_stack_fffffffffffffcd0,v_02);
                }
                if (local_198 != (void *)0x0) {
                  JS_DupValue(local_128,*pJVar10);
                }
                local_148[1].ptr = local_198;
              }
            }
          }
          iVar1 = js_update_property_flags
                            ((JSContext *)in_stack_fffffffffffffcd8.ptr,
                             (JSObject *)in_stack_fffffffffffffcd0,
                             (JSShapeProperty **)in_stack_fffffffffffffcc8,0);
          if (iVar1 == 0) {
            return 1;
          }
          return -1;
        }
        iVar1 = JS_AutoInitProperty(in_stack_fffffffffffffd28,
                                    (JSObject *)
                                    CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                                    (JSAtom)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                                    in_stack_fffffffffffffd10,
                                    (JSShapeProperty *)
                                    CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        if (iVar1 != 0) {
          return -1;
        }
        goto LAB_0012dff1;
      }
      if (((local_138->field_0).header.dummy1 >> 3 & 1) == 0) {
LAB_0012f45c:
        val_05.tag._0_4_ = in_stack_fffffffffffffdf8;
        val_05.u = (JSValueUnion)in_stack_fffffffffffffdf0;
        val_05.tag._4_4_ = in_stack_fffffffffffffdfc;
        getter_00.tag = (int64_t)in_stack_fffffffffffffe88.ptr;
        getter_00.u.float64 = in_stack_fffffffffffffe80.float64;
        setter_00.tag._0_4_ = in_stack_fffffffffffffe98;
        setter_00.u = (JSValueUnion)in_stack_fffffffffffffe90;
        setter_00.tag._4_4_ = in_stack_fffffffffffffe9c;
        iVar1 = JS_CreateProperty(in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
                                  (JSAtom)((ulong)in_stack_fffffffffffffdd8 >> 0x20),val_05,
                                  getter_00,setter_00,(int)in_stack_fffffffffffffdd8);
        return iVar1;
      }
      if ((local_138->field_0).header.dummy2 != 2) {
        if (((local_138->field_0).header.dummy2 < 0x15) ||
           (0x1d < (local_138->field_0).header.dummy2)) goto LAB_0012f45c;
        BVar2 = __JS_AtomIsTaggedInt(local_12c);
        if (BVar2 == 0) {
          JVar7 = JS_AtomIsNumericIndex1(in_stack_fffffffffffffd80,in_stack_fffffffffffffd7c);
          in_stack_fffffffffffffd68 = JVar7.u;
          local_290 = JVar7.tag;
          JVar11 = in_stack_fffffffffffffd68;
          iVar1 = JS_IsUndefined(JVar7);
          if (iVar1 != 0) goto LAB_0012f45c;
          JVar7.tag = local_290;
          JVar7.u.ptr = JVar11.ptr;
          iVar1 = JS_IsException(JVar7);
          if (iVar1 != 0) {
            return -1;
          }
          val_00.tag = (int64_t)in_stack_fffffffffffffce8;
          val_00.u.ptr = in_stack_fffffffffffffce0.ptr;
          iVar1 = JS_NumberIsInteger((JSContext *)in_stack_fffffffffffffcd8.ptr,val_00);
          if (iVar1 < 0) {
            v_06.tag = (int64_t)in_stack_fffffffffffffce0.ptr;
            v_06.u.ptr = in_stack_fffffffffffffcd8.ptr;
            JS_FreeValue(in_stack_fffffffffffffcd0,v_06);
            return -1;
          }
          if (iVar1 == 0) {
            v_07.tag = (int64_t)in_stack_fffffffffffffce0.ptr;
            v_07.u.ptr = in_stack_fffffffffffffcd8.ptr;
            JS_FreeValue(in_stack_fffffffffffffcd0,v_07);
            iVar1 = JS_ThrowTypeErrorOrFalse
                              (local_128,(int)(ulong)in_stack_00000028,
                               "non integer index in typed array");
            return iVar1;
          }
          val_04.tag = local_290;
          val_04.u.ptr = JVar11.ptr;
          BVar2 = JS_NumberIsNegativeOrMinusZero(local_128,val_04);
          v_08.tag = (int64_t)in_stack_fffffffffffffce0.ptr;
          v_08.u.ptr = in_stack_fffffffffffffcd8.ptr;
          JS_FreeValue(in_stack_fffffffffffffcd0,v_08);
          if (BVar2 != 0) {
            iVar1 = JS_ThrowTypeErrorOrFalse
                              (local_128,(int)(ulong)in_stack_00000028,
                               "negative index in typed array");
            return iVar1;
          }
          BVar2 = __JS_AtomIsTaggedInt(local_12c);
          if (BVar2 == 0) goto LAB_0012f2d2;
        }
        uVar4 = __JS_AtomToUInt32(local_12c);
        uVar3 = uVar4;
        uVar5 = typed_array_get_length(local_128,local_138);
        if (uVar4 < uVar5) {
          iVar1 = get_prop_flags(in_stack_00000028,7);
          if (((in_stack_00000028 & 0x1800) == 0) && (iVar1 == 7)) {
            if ((in_stack_00000028 & 0x2000) == 0) {
              return 1;
            }
            local_f8 = local_128;
            local_e8 = 0;
            JVar11.float64 = 0.0;
            v_14.tag = (int64_t)local_118.ptr;
            v_14.u.float64 = local_120.float64;
            local_fc = uVar3;
            local_f0 = uVar3;
            JVar7 = JS_DupValue(local_128,v_14);
            this_obj_00.tag = (int64_t)JVar7.u.ptr;
            this_obj_00.u.float64 = p_00.float64;
            prop_00.tag._0_4_ = (int)pJVar10;
            prop_00.u = (JSValueUnion)in_stack_fffffffffffffd30;
            prop_00.tag._4_4_ = (int)((ulong)pJVar10 >> 0x20);
            val_03.tag = (int64_t)in_stack_fffffffffffffd68.ptr;
            val_03.u.float64 = JVar11.float64;
            iVar1 = JS_SetPropertyValue(in_stack_fffffffffffffd28,this_obj_00,prop_00,val_03,
                                        in_stack_fffffffffffffd24);
            return iVar1;
          }
          iVar1 = JS_ThrowTypeErrorOrFalse
                            (local_128,(int)(ulong)in_stack_00000028,"invalid descriptor flags");
          return iVar1;
        }
LAB_0012f2d2:
        iVar1 = JS_ThrowTypeErrorOrFalse
                          (local_128,(int)(ulong)in_stack_00000028,
                           "out-of-bound index in typed array");
        return iVar1;
      }
      BVar2 = __JS_AtomIsTaggedInt(local_12c);
      if ((BVar2 == 0) ||
         (uVar3 = __JS_AtomToUInt32(local_12c), (local_138->u).array.count <= uVar3))
      goto LAB_0012f45c;
      iVar1 = get_prop_flags(in_stack_00000028,7);
      if ((iVar1 == 7) && ((in_stack_00000028 & 0x1800) == 0)) {
        if ((in_stack_00000028 & 0x2000) != 0) {
          v_13.tag = (int64_t)local_118.ptr;
          v_13.u.ptr = local_120.ptr;
          JS_DupValue(local_128,v_13);
          new_val_00.tag._0_4_ = in_stack_fffffffffffffcf0;
          new_val_00.u = (JSValueUnion)in_stack_fffffffffffffce8;
          new_val_00.tag._4_4_ = in_stack_fffffffffffffcf4;
          set_value((JSContext *)in_stack_fffffffffffffce0.ptr,
                    (JSValue *)in_stack_fffffffffffffcd8.ptr,new_val_00);
        }
        return 1;
      }
      iVar1 = convert_fast_array_to_array
                        ((JSContext *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                         in_stack_fffffffffffffd00);
    } while (iVar1 == 0);
  }
  else {
    JS_ThrowTypeErrorNotAnObject((JSContext *)0x12dfc1);
  }
  return -1;
}

Assistant:

int JS_DefineProperty(JSContext *ctx, JSValueConst this_obj,
                      JSAtom prop, JSValueConst val,
                      JSValueConst getter, JSValueConst setter, int flags)
{
    JSObject *p;
    JSShapeProperty *prs;
    JSProperty *pr;
    int mask, res;

    if (JS_VALUE_GET_TAG(this_obj) != JS_TAG_OBJECT) {
        JS_ThrowTypeErrorNotAnObject(ctx);
        return -1;
    }
    p = JS_VALUE_GET_OBJ(this_obj);

 redo_prop_update:
    prs = find_own_property(&pr, p, prop);
    if (prs) {
        /* the range of the Array length property is always tested before */
        if ((prs->flags & JS_PROP_LENGTH) && (flags & JS_PROP_HAS_VALUE)) {
            uint32_t array_length;
            if (JS_ToArrayLengthFree(ctx, &array_length,
                                     JS_DupValue(ctx, val), FALSE)) {
                return -1;
            }
            /* this code relies on the fact that Uint32 are never allocated */
            val = (JSValueConst)JS_NewUint32(ctx, array_length);
            /* prs may have been modified */
            prs = find_own_property(&pr, p, prop);
            assert(prs != NULL);
        }
        /* property already exists */
        if (!check_define_prop_flags(prs->flags, flags)) {
        not_configurable:
            return JS_ThrowTypeErrorOrFalse(ctx, flags, "property is not configurable");
        }

        if ((prs->flags & JS_PROP_TMASK) == JS_PROP_AUTOINIT) {
            /* Instantiate property and retry */
            if (JS_AutoInitProperty(ctx, p, prop, pr, prs))
                return -1;
            goto redo_prop_update;
        }

        if (flags & (JS_PROP_HAS_VALUE | JS_PROP_HAS_WRITABLE |
                     JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
            if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
                JSObject *new_getter, *new_setter;

                if (JS_IsFunction(ctx, getter)) {
                    new_getter = JS_VALUE_GET_OBJ(getter);
                } else {
                    new_getter = NULL;
                }
                if (JS_IsFunction(ctx, setter)) {
                    new_setter = JS_VALUE_GET_OBJ(setter);
                } else {
                    new_setter = NULL;
                }

                if ((prs->flags & JS_PROP_TMASK) != JS_PROP_GETSET) {
                    if (js_shape_prepare_update(ctx, p, &prs))
                        return -1;
                    /* convert to getset */
                    if ((prs->flags & JS_PROP_TMASK) == JS_PROP_VARREF) {
                        free_var_ref(ctx->rt, pr->u.var_ref);
                    } else {
                        JS_FreeValue(ctx, pr->u.value);
                    }
                    prs->flags = (prs->flags &
                                  (JS_PROP_CONFIGURABLE | JS_PROP_ENUMERABLE)) |
                        JS_PROP_GETSET;
                    pr->u.getset.getter = NULL;
                    pr->u.getset.setter = NULL;
                } else {
                    if (!(prs->flags & JS_PROP_CONFIGURABLE)) {
                        if ((flags & JS_PROP_HAS_GET) &&
                            new_getter != pr->u.getset.getter) {
                            goto not_configurable;
                        }
                        if ((flags & JS_PROP_HAS_SET) &&
                            new_setter != pr->u.getset.setter) {
                            goto not_configurable;
                        }
                    }
                }
                if (flags & JS_PROP_HAS_GET) {
                    if (pr->u.getset.getter)
                        JS_FreeValue(ctx, JS_MKPTR(JS_TAG_OBJECT, pr->u.getset.getter));
                    if (new_getter)
                        JS_DupValue(ctx, getter);
                    pr->u.getset.getter = new_getter;
                }
                if (flags & JS_PROP_HAS_SET) {
                    if (pr->u.getset.setter)
                        JS_FreeValue(ctx, JS_MKPTR(JS_TAG_OBJECT, pr->u.getset.setter));
                    if (new_setter)
                        JS_DupValue(ctx, setter);
                    pr->u.getset.setter = new_setter;
                }
            } else {
                if ((prs->flags & JS_PROP_TMASK) == JS_PROP_GETSET) {
                    /* convert to data descriptor */
                    if (js_shape_prepare_update(ctx, p, &prs))
                        return -1;
                    if (pr->u.getset.getter)
                        JS_FreeValue(ctx, JS_MKPTR(JS_TAG_OBJECT, pr->u.getset.getter));
                    if (pr->u.getset.setter)
                        JS_FreeValue(ctx, JS_MKPTR(JS_TAG_OBJECT, pr->u.getset.setter));
                    prs->flags &= ~(JS_PROP_TMASK | JS_PROP_WRITABLE);
                    pr->u.value = JS_UNDEFINED;
                } else if ((prs->flags & JS_PROP_TMASK) == JS_PROP_VARREF) {
                    /* Note: JS_PROP_VARREF is always writable */
                } else {
                    if ((prs->flags & (JS_PROP_CONFIGURABLE | JS_PROP_WRITABLE)) == 0 &&
                        (flags & JS_PROP_HAS_VALUE)) {
                        if (!js_same_value(ctx, val, pr->u.value)) {
                            goto not_configurable;
                        } else {
                            return TRUE;
                        }
                    }
                }
                if ((prs->flags & JS_PROP_TMASK) == JS_PROP_VARREF) {
                    if (flags & JS_PROP_HAS_VALUE) {
                        if (p->class_id == JS_CLASS_MODULE_NS) {
                            /* JS_PROP_WRITABLE is always true for variable
                               references, but they are write protected in module name
                               spaces. */
                            if (!js_same_value(ctx, val, *pr->u.var_ref->pvalue))
                                goto not_configurable;
                        }
                        /* update the reference */
                        set_value(ctx, pr->u.var_ref->pvalue,
                                  JS_DupValue(ctx, val));
                    }
                    /* if writable is set to false, no longer a
                       reference (for mapped arguments) */
                    if ((flags & (JS_PROP_HAS_WRITABLE | JS_PROP_WRITABLE)) == JS_PROP_HAS_WRITABLE) {
                        JSValue val1;
                        if (js_shape_prepare_update(ctx, p, &prs))
                            return -1;
                        val1 = JS_DupValue(ctx, *pr->u.var_ref->pvalue);
                        free_var_ref(ctx->rt, pr->u.var_ref);
                        pr->u.value = val1;
                        prs->flags &= ~(JS_PROP_TMASK | JS_PROP_WRITABLE);
                    }
                } else if (prs->flags & JS_PROP_LENGTH) {
                    if (flags & JS_PROP_HAS_VALUE) {
                        /* Note: no JS code is executable because
                           'val' is guaranted to be a Uint32 */
                        res = set_array_length(ctx, p, JS_DupValue(ctx, val),
                                               flags);
                    } else {
                        res = TRUE;
                    }
                    /* still need to reset the writable flag if
                       needed.  The JS_PROP_LENGTH is kept because the
                       Uint32 test is still done if the length
                       property is read-only. */
                    if ((flags & (JS_PROP_HAS_WRITABLE | JS_PROP_WRITABLE)) ==
                        JS_PROP_HAS_WRITABLE) {
                        prs = get_shape_prop(p->shape);
                        if (js_update_property_flags(ctx, p, &prs,
                                                     prs->flags & ~JS_PROP_WRITABLE))
                            return -1;
                    }
                    return res;
                } else {
                    if (flags & JS_PROP_HAS_VALUE) {
                        JS_FreeValue(ctx, pr->u.value);
                        pr->u.value = JS_DupValue(ctx, val);
                    }
                    if (flags & JS_PROP_HAS_WRITABLE) {
                        if (js_update_property_flags(ctx, p, &prs,
                                                     (prs->flags & ~JS_PROP_WRITABLE) |
                                                     (flags & JS_PROP_WRITABLE)))
                            return -1;
                    }
                }
            }
        }
        mask = 0;
        if (flags & JS_PROP_HAS_CONFIGURABLE)
            mask |= JS_PROP_CONFIGURABLE;
        if (flags & JS_PROP_HAS_ENUMERABLE)
            mask |= JS_PROP_ENUMERABLE;
        if (js_update_property_flags(ctx, p, &prs,
                                     (prs->flags & ~mask) | (flags & mask)))
            return -1;
        return TRUE;
    }

    /* handle modification of fast array elements */
    if (p->fast_array) {
        uint32_t idx;
        uint32_t prop_flags;
        if (p->class_id == JS_CLASS_ARRAY) {
            if (__JS_AtomIsTaggedInt(prop)) {
                idx = __JS_AtomToUInt32(prop);
                if (idx < p->u.array.count) {
                    prop_flags = get_prop_flags(flags, JS_PROP_C_W_E);
                    if (prop_flags != JS_PROP_C_W_E)
                        goto convert_to_slow_array;
                    if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET)) {
                    convert_to_slow_array:
                        if (convert_fast_array_to_array(ctx, p))
                            return -1;
                        else
                            goto redo_prop_update;
                    }
                    if (flags & JS_PROP_HAS_VALUE) {
                        set_value(ctx, &p->u.array.u.values[idx], JS_DupValue(ctx, val));
                    }
                    return TRUE;
                }
            }
        } else if (p->class_id >= JS_CLASS_UINT8C_ARRAY &&
                   p->class_id <= JS_CLASS_FLOAT64_ARRAY) {
            JSValue num;
            int ret;

            if (!__JS_AtomIsTaggedInt(prop)) {
                /* slow path with to handle all numeric indexes */
                num = JS_AtomIsNumericIndex1(ctx, prop);
                if (JS_IsUndefined(num))
                    goto typed_array_done;
                if (JS_IsException(num))
                    return -1;
                ret = JS_NumberIsInteger(ctx, num);
                if (ret < 0) {
                    JS_FreeValue(ctx, num);
                    return -1;
                }
                if (!ret) {
                    JS_FreeValue(ctx, num);
                    return JS_ThrowTypeErrorOrFalse(ctx, flags, "non integer index in typed array");
                }
                ret = JS_NumberIsNegativeOrMinusZero(ctx, num);
                JS_FreeValue(ctx, num);
                if (ret) {
                    return JS_ThrowTypeErrorOrFalse(ctx, flags, "negative index in typed array");
                }
                if (!__JS_AtomIsTaggedInt(prop))
                    goto typed_array_oob;
            }
            idx = __JS_AtomToUInt32(prop);
            /* if the typed array is detached, p->u.array.count = 0 */
            if (idx >= typed_array_get_length(ctx, p)) {
            typed_array_oob:
                return JS_ThrowTypeErrorOrFalse(ctx, flags, "out-of-bound index in typed array");
            }
            prop_flags = get_prop_flags(flags, JS_PROP_ENUMERABLE | JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE);
            if (flags & (JS_PROP_HAS_GET | JS_PROP_HAS_SET) ||
                prop_flags != (JS_PROP_ENUMERABLE | JS_PROP_WRITABLE | JS_PROP_CONFIGURABLE)) {
                return JS_ThrowTypeErrorOrFalse(ctx, flags, "invalid descriptor flags");
            }
            if (flags & JS_PROP_HAS_VALUE) {
                return JS_SetPropertyValue(ctx, this_obj, JS_NewInt32(ctx, idx), JS_DupValue(ctx, val), flags);
            }
            return TRUE;
        typed_array_done: ;
        }
    }

    return JS_CreateProperty(ctx, p, prop, val, getter, setter, flags);
}